

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::validateKTXorientation(ValidationContext *this,uint8_t *data,uint32_t size)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  uint in_EDX;
  char *in_RSI;
  char *in_RDI;
  uint *in_stack_00000010;
  unsigned_long *in_stack_00000018;
  IssueError *in_stack_00000020;
  ValidationContext *in_stack_00000028;
  IssueError *in_stack_00000030;
  ValidationContext *in_stack_00000038;
  string_view value;
  bool hasNull;
  uint local_84;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> in_stack_ffffffffffffff98;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  byte local_15;
  uint local_14;
  char *local_10;
  
  in_RDI[0x116] = '\x01';
  uVar4 = false;
  if (in_EDX != 0) {
    uVar4 = in_RSI[in_EDX - 1] == '\0';
  }
  local_15 = uVar4;
  local_14 = in_EDX;
  local_10 = in_RSI;
  if ((bool)uVar4 == false) {
    error<>(in_stack_00000028,in_stack_00000020);
  }
  if ((local_15 & 1) == 0) {
    local_84 = local_14;
  }
  else {
    local_84 = local_14 - 1;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,local_10,(ulong)local_84);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_28);
  if (sVar2 != *(uint *)(in_RDI + 0x90)) {
    std::basic_string_view<char,_std::char_traits<char>_>::size(&local_28);
    error<unsigned_long,unsigned_int&>
              (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  }
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_28);
  if ((((sVar2 != 0) && (*(int *)(in_RDI + 0x90) != 0)) &&
      (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_28,0),
      *pvVar3 != 'r')) &&
     (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_28,0),
     *pvVar3 != 'l')) {
    std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_28,0);
    error<int,char_const&,char,char>
              (in_stack_00000038,in_stack_00000030,(int *)in_stack_00000028,
               (char *)in_stack_00000020,(char *)in_stack_00000018,(char *)in_stack_00000010);
  }
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_28);
  if (((1 < sVar2) && (1 < *(uint *)(in_RDI + 0x90))) &&
     ((pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_28,1),
      *pvVar3 != 'd' &&
      (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_28,1),
      *pvVar3 != 'u')))) {
    std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_28,1);
    error<int,char_const&,char,char>
              (in_stack_00000038,in_stack_00000030,(int *)in_stack_00000028,
               (char *)in_stack_00000020,(char *)in_stack_00000018,(char *)in_stack_00000010);
  }
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_28);
  if (((2 < sVar2) && (2 < *(uint *)(in_RDI + 0x90))) &&
     ((pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_28,2),
      *pvVar3 != 'o' &&
      (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_28,2),
      *pvVar3 != 'i')))) {
    std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_28,2);
    error<int,char_const&,char,char>
              (in_stack_00000038,in_stack_00000030,(int *)in_stack_00000028,
               (char *)in_stack_00000020,(char *)in_stack_00000018,(char *)in_stack_00000010);
  }
  if ((in_RDI[0x29] & 1U) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(uVar4,in_stack_ffffffffffffff90),in_RDI);
    __x._M_str = local_28._M_str;
    __x._M_len = local_28._M_len;
    bVar1 = std::operator!=(__x,in_stack_ffffffffffffff98);
    if (bVar1) {
      error<std::basic_string_view<char,std::char_traits<char>>const&>
                (in_stack_00000038,in_stack_00000030,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_00000028);
    }
  }
  return;
}

Assistant:

void ValidationContext::validateKTXorientation(const uint8_t* data, uint32_t size) {
    foundKTXorientation = true;

    const auto hasNull = size > 0 && data[size - 1] == '\0';
    if (!hasNull)
        error(Metadata::KTXorientationMissingNull);

    const auto value = std::string_view(reinterpret_cast<const char*>(data), hasNull ? size - 1 : size);

    if (value.size() != dimensionCount)
        error(Metadata::KTXorientationIncorrectDimension, value.size(), dimensionCount);

    if (value.size() > 0 && dimensionCount > 0 && value[0] != 'r' && value[0] != 'l')
        error(Metadata::KTXorientationInvalidValue, 0, value[0], 'r', 'l');

    if (value.size() > 1 && dimensionCount > 1 && value[1] != 'd' && value[1] != 'u')
        error(Metadata::KTXorientationInvalidValue, 1, value[1], 'd', 'u');

    if (value.size() > 2 && dimensionCount > 2 && value[2] != 'o' && value[2] != 'i')
        error(Metadata::KTXorientationInvalidValue, 2, value[2], 'o', 'i');

    if (checkGLTFBasisU && value != "rd")
        error(Metadata::KTXorientationInvalidGLTFBU, value);
}